

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::FboCases::SharedColorbufferTest::SharedColorbufferTest
          (SharedColorbufferTest *this,Context *context,FboConfig *config)

{
  int iVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  GLenum GVar5;
  GLenum GVar6;
  GLenum GVar7;
  string local_40;
  
  FboConfig::getName_abi_cxx11_(&local_40,config);
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,local_40._M_dataplus._M_p,"Shared colorbuffer");
  (this->super_FboRenderCase).super_TestCase.m_context = context;
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02149a10;
  dVar4 = config->buffers;
  GVar5 = config->colorType;
  GVar6 = config->colorFormat;
  GVar7 = config->depthStencilType;
  iVar1 = config->width;
  iVar2 = config->height;
  iVar3 = config->samples;
  (this->super_FboRenderCase).m_config.depthStencilFormat = config->depthStencilFormat;
  (this->super_FboRenderCase).m_config.width = iVar1;
  (this->super_FboRenderCase).m_config.height = iVar2;
  (this->super_FboRenderCase).m_config.samples = iVar3;
  (this->super_FboRenderCase).m_config.buffers = dVar4;
  (this->super_FboRenderCase).m_config.colorType = GVar5;
  (this->super_FboRenderCase).m_config.colorFormat = GVar6;
  (this->super_FboRenderCase).m_config.depthStencilType = GVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02149a90;
  return;
}

Assistant:

SharedColorbufferTest::SharedColorbufferTest (Context& context, const FboConfig& config)
	: FboRenderCase	(context, config.getName().c_str(), "Shared colorbuffer", config)
{
}